

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestResponseFiles::Run(ParserTestResponseFiles *this)

{
  int iVar1;
  Rule *this_00;
  Test *pTVar2;
  bool bVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  *pmVar4;
  EvalString *pEVar5;
  BindingEnv *this_01;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat_rsp\n  command = cat $rspfile > $out\n  rspfile = $rspfile\n  rspfile_content = $in\n\nbuild out: cat_rsp in\n  rspfile=out.rsp\n"
            );
  pTVar2 = g_current_test;
  if (iVar1 == g_current_test->assertion_failures_) {
    this_01 = &(this->super_ParserTest).state.bindings_;
    pmVar4 = BindingEnv::GetRules_abi_cxx11_(this_01);
    bVar3 = testing::Test::Check
                      (pTVar2,(pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x77,"2u == state.bindings_.GetRules().size()");
    if (bVar3) {
      pmVar4 = BindingEnv::GetRules_abi_cxx11_(this_01);
      pTVar2 = g_current_test;
      this_00 = *(Rule **)((pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 2);
      bVar3 = std::operator==("cat_rsp",&this_00->name_);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x79,"\"cat_rsp\" == rule->name()");
      pTVar2 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"command",&local_61);
      pEVar5 = Rule::GetBinding(this_00,&local_60);
      EvalString::Serialize_abi_cxx11_(&local_40,pEVar5);
      bVar3 = std::operator==("[cat ][$rspfile][ > ][$out]",&local_40);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x7b,
                 "\"[cat ][$rspfile][ > ][$out]\" == rule->GetBinding(\"command\")->Serialize()");
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      pTVar2 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"rspfile",&local_61);
      pEVar5 = Rule::GetBinding(this_00,&local_60);
      EvalString::Serialize_abi_cxx11_(&local_40,pEVar5);
      bVar3 = std::operator==("[$rspfile]",&local_40);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x7c,"\"[$rspfile]\" == rule->GetBinding(\"rspfile\")->Serialize()");
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      pTVar2 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"rspfile_content",&local_61);
      pEVar5 = Rule::GetBinding(this_00,&local_60);
      EvalString::Serialize_abi_cxx11_(&local_40,pEVar5);
      bVar3 = std::operator==("[$in]",&local_40);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x7d,"\"[$in]\" == rule->GetBinding(\"rspfile_content\")->Serialize()");
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, ResponseFiles) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat_rsp\n"
"  command = cat $rspfile > $out\n"
"  rspfile = $rspfile\n"
"  rspfile_content = $in\n"
"\n"
"build out: cat_rsp in\n"
"  rspfile=out.rsp\n"));

  ASSERT_EQ(2u, state.bindings_.GetRules().size());
  const Rule* rule = state.bindings_.GetRules().begin()->second;
  EXPECT_EQ("cat_rsp", rule->name());
  EXPECT_EQ("[cat ][$rspfile][ > ][$out]",
            rule->GetBinding("command")->Serialize());
  EXPECT_EQ("[$rspfile]", rule->GetBinding("rspfile")->Serialize());
  EXPECT_EQ("[$in]", rule->GetBinding("rspfile_content")->Serialize());
}